

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

IShaderResourceVariable * __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetStaticVariableByIndex
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,SHADER_TYPE ShaderType,
          Uint32 Index)

{
  undefined *puVar1;
  bool bVar2;
  Int32 IVar3;
  uint uVar4;
  Uint32 UVar5;
  undefined8 uVar6;
  reference pvVar7;
  Char *Message;
  char (*in_stack_ffffffffffffff48) [3];
  undefined1 local_90 [8];
  string msg;
  int VarMngrInd;
  Int32 ShaderTypeInd;
  char *local_58;
  Char *local_50;
  undefined1 local_48 [8];
  string _msg;
  Uint32 Index_local;
  SHADER_TYPE ShaderType_local;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  _msg.field_2._8_4_ = Index;
  _msg.field_2._12_4_ = ShaderType;
  bVar2 = IsConsistentShaderType(ShaderType,this->m_PipelineType);
  if (bVar2) {
    IVar3 = GetShaderTypePipelineIndex(_msg.field_2._12_4_,this->m_PipelineType);
    pvVar7 = std::array<signed_char,_6UL>::operator[](&this->m_StaticResStageIndex,(long)IVar3);
    uVar4 = (uint)*pvVar7;
    if ((int)uVar4 < 0) {
      this_local = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)0x0;
    }
    else {
      msg.field_2._12_4_ = uVar4;
      UVar5 = GetNumStaticResStages(this);
      if (UVar5 <= uVar4) {
        FormatString<char[26],char[58]>
                  ((string *)local_90,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages()",
                   (char (*) [58])(ulong)UVar5);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"GetStaticVariableByIndex",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                   ,0x1f1);
        std::__cxx11::string::~string((string *)local_90);
      }
      this_local = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)
                   ShaderVariableManagerVk::GetVariable
                             (this->m_StaticVarsMgrs + (int)msg.field_2._12_4_,_msg.field_2._8_4_);
    }
  }
  else {
    local_50 = GetShaderTypeLiteralName(_msg.field_2._12_4_);
    local_58 = GetPipelineTypeString(this->m_PipelineType);
    FormatString<char[40],unsigned_int,char[18],char_const*,char[30],char_const*,char[31],char_const*,char[3]>
              ((string *)local_48,(Diligent *)"Unable to get static variable at index ",
               (char (*) [40])((long)&_msg.field_2 + 8),(uint *)0xe3468a,(char (*) [18])&local_50,
               (char **)" as the stage is invalid for ",(char (*) [30])&local_58,(char **)0xf509b1,
               (char (*) [31])
               &(this->
                super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                ).m_Desc,(char **)"\'.",in_stack_ffffffffffffff48);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar6,0);
    }
    std::__cxx11::string::~string((string *)local_48);
    this_local = (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *)0x0;
  }
  return (IShaderResourceVariable *)this_local;
}

Assistant:

GetStaticVariableByIndex(SHADER_TYPE ShaderType,
                                                                                 Uint32      Index) override final
    {
        if (!IsConsistentShaderType(ShaderType, m_PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to get static variable at index ", Index, " in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(m_PipelineType), " pipeline resource signature '", this->m_Desc.Name, "'.");
            return nullptr;
        }

        const Int32 ShaderTypeInd = GetShaderTypePipelineIndex(ShaderType, m_PipelineType);
        const int   VarMngrInd    = m_StaticResStageIndex[ShaderTypeInd];
        if (VarMngrInd < 0)
            return nullptr;

        VERIFY_EXPR(static_cast<Uint32>(VarMngrInd) < GetNumStaticResStages());
        return m_StaticVarsMgrs[VarMngrInd].GetVariable(Index);
    }